

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_sei.c
# Opt level: O0

MPP_RET h264e_sei_recovery_point_to_packet(MppPacket packet,RK_S32 *len,RK_U32 recovery_frame_cnt)

{
  RK_S32 RVar1;
  uint len_00;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int local_100;
  RK_S32 i;
  RK_S32 sei_size;
  RK_U8 src [100];
  RK_S32 type;
  RK_S32 payload_size;
  MppWriteCtx *bit;
  MppWriteCtx bit_ctx;
  RK_S32 buf_size;
  void *dst;
  size_t length;
  size_t pkt_size;
  void *pkt_base;
  void *pos;
  MPP_RET ret;
  RK_U32 recovery_frame_cnt_local;
  RK_S32 *len_local;
  MppPacket packet_local;
  
  pvVar2 = mpp_packet_get_pos(packet);
  pvVar3 = mpp_packet_get_data(packet);
  sVar4 = mpp_packet_get_size(packet);
  sVar5 = mpp_packet_get_length(packet);
  bit_ctx._44_4_ = ((int)pvVar3 + (int)sVar4) - ((int)pvVar2 + (int)sVar5);
  src[0x60] = '\x06';
  src[0x61] = '\0';
  src[0x62] = '\0';
  src[99] = '\0';
  memset(&i,0,100);
  mpp_writer_init((MppWriteCtx *)&bit,&i,100);
  write_recovery_point((MppWriteCtx *)&bit,recovery_frame_cnt);
  RVar1 = mpp_writer_bytes((MppWriteCtx *)&bit);
  mpp_writer_init((MppWriteCtx *)&bit,(void *)((long)pvVar2 + sVar5),bit_ctx._44_4_);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bit,0,0x18);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bit,1,8);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bit,0,1);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bit,0,2);
  mpp_writer_put_raw_bits((MppWriteCtx *)&bit,6,5);
  for (local_100 = 0; local_100 <= src._96_4_ + -0xff; local_100 = local_100 + 0xff) {
    mpp_writer_put_bits((MppWriteCtx *)&bit,0xff,8);
  }
  mpp_writer_put_bits((MppWriteCtx *)&bit,src._96_4_ - local_100,8);
  for (local_100 = 0; local_100 <= RVar1 + -0xff; local_100 = local_100 + 0xff) {
    mpp_writer_put_bits((MppWriteCtx *)&bit,0xff,8);
  }
  mpp_writer_put_bits((MppWriteCtx *)&bit,RVar1 - local_100,8);
  write_recovery_point((MppWriteCtx *)&bit,recovery_frame_cnt);
  len_00 = mpp_writer_bytes((MppWriteCtx *)&bit);
  if (len != (RK_S32 *)0x0) {
    *len = len_00;
  }
  mpp_packet_set_length(packet,sVar5 + (long)(int)len_00);
  mpp_packet_add_segment_info(packet,6,(int)sVar5,len_00);
  if ((h264e_debug & 0x80) != 0) {
    _mpp_log_l(4,"h264e_sei","sei data length %d pkt len %d -> %d\n",
               "h264e_sei_recovery_point_to_packet",(ulong)len_00,sVar5,sVar5 + (long)(int)len_00);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_sei_recovery_point_to_packet(MppPacket packet, RK_S32 *len, RK_U32 recovery_frame_cnt)
{
    MPP_RET ret = MPP_OK;
    void *pos = mpp_packet_get_pos(packet);
    void *pkt_base = mpp_packet_get_data(packet);
    size_t pkt_size = mpp_packet_get_size(packet);
    size_t length = mpp_packet_get_length(packet);
    void *dst = pos + length;
    RK_S32 buf_size = (pkt_base + pkt_size) - (pos + length);
    MppWriteCtx bit_ctx;
    MppWriteCtx *bit = &bit_ctx;
    RK_S32 payload_size = 0;
    RK_S32 type = H264_SEI_RECOVERY_POINT;
    RK_U8 src[100] = {0};
    RK_S32 sei_size = 0;
    RK_S32 i;
    mpp_writer_init(bit, src, 100);
    write_recovery_point(bit, recovery_frame_cnt);
    payload_size = mpp_writer_bytes(bit);

    mpp_writer_init(bit, dst, buf_size);

    /* start_code_prefix 00 00 00 01 */
    mpp_writer_put_raw_bits(bit, 0, 24);
    mpp_writer_put_raw_bits(bit, 1, 8);
    /* forbidden_zero_bit */
    mpp_writer_put_raw_bits(bit, 0, 1);
    /* nal_ref_idc */
    mpp_writer_put_raw_bits(bit, H264_NALU_PRIORITY_DISPOSABLE, 2);
    /* nal_unit_type */
    mpp_writer_put_raw_bits(bit, H264_NALU_TYPE_SEI, 5);

    /* sei_payload_type_ff_byte */
    for (i = 0; i <= type - 255; i += 255)
        mpp_writer_put_bits(bit, 0xff, 8);

    /* sei_last_payload_type_byte */
    mpp_writer_put_bits(bit, type - i, 8);

    /* sei_payload_size_ff_byte */
    for (i = 0; i <= payload_size - 255; i += 255)
        mpp_writer_put_bits(bit, 0xff, 8);

    /* sei_last_payload_size_byte */
    mpp_writer_put_bits(bit, payload_size - i, 8);

    write_recovery_point(bit, recovery_frame_cnt);

    sei_size = mpp_writer_bytes(bit);
    if (len)
        *len = sei_size;

    mpp_packet_set_length(packet, length + sei_size);
    mpp_packet_add_segment_info(packet, H264_NALU_TYPE_SEI, length, sei_size);

    h264e_dbg_sei("sei data length %d pkt len %d -> %d\n", sei_size,
                  length, length + sei_size);

    return ret;

}